

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

int sengr_at(char *s,xchar x,xchar y)

{
  uint uVar1;
  engr *peVar2;
  char *pcVar3;
  
  peVar2 = engr_at(level,x,y);
  uVar1 = 0;
  if (((peVar2 != (engr *)0x0) && (peVar2->engr_type != '\x06')) &&
     (peVar2->engr_time <= (long)(ulong)moves)) {
    pcVar3 = strstri(peVar2->engr_txt,s);
    uVar1 = (uint)(pcVar3 != (char *)0x0);
  }
  return uVar1;
}

Assistant:

int sengr_at(const char *s, xchar x, xchar y)
{
	struct engr *ep = engr_at(level, x,y);

	return (ep && ep->engr_type != HEADSTONE &&
		ep->engr_time <= moves && strstri(ep->engr_txt, s) != 0);
}